

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O1

void ga_init_nbhandle(Integer *nbhandle)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  Integer itmp;
  uint local_20 [2];
  
  uVar2 = (long)(lastGAhandle + 1) % (long)nb_max_outstanding;
  lastGAhandle = (int)uVar2;
  uVar3 = lastGAhandle;
  if (0 < nb_max_outstanding) {
    uVar2 = uVar2 & 0xffffffff;
    do {
      uVar3 = (int)uVar2 % nb_max_outstanding;
      if (ga_ihdl_array[(int)uVar3].ahandle == (ga_armcihdl_t *)0x0) break;
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
      uVar3 = lastGAhandle;
    } while ((int)uVar1 < lastGAhandle + nb_max_outstanding);
  }
  if (ga_ihdl_array[(int)uVar3].ahandle != (ga_armcihdl_t *)0x0) {
    local_20[0] = ga_ihdl_array[(int)uVar3].ga_nbtag << 8 | uVar3 & 0xff;
    nga_wait_internal((Integer *)local_20);
  }
  *(char *)nbhandle = (char)uVar3;
  uVar1 = ga_nb_tag + 1;
  uVar4 = uVar1 & 0xffffff;
  ga_nb_tag = uVar4;
  *(uint *)nbhandle = uVar1 * 0x100 | uVar3 & 0xff;
  ga_ihdl_array[(int)uVar3].ahandle = (ga_armcihdl_t *)0x0;
  ga_ihdl_array[(int)uVar3].count = 0;
  ga_ihdl_array[(int)uVar3].active = 1;
  ga_ihdl_array[(int)uVar3].ga_nbtag = uVar4;
  lastGAhandle = uVar3;
  return;
}

Assistant:

void ga_init_nbhandle(Integer *nbhandle)
{
  int i, top, idx, iloc;
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  lastGAhandle++;
  lastGAhandle = lastGAhandle%nb_max_outstanding;
  top = lastGAhandle+nb_max_outstanding;
  /* default index if no handles are available */
  idx = lastGAhandle;
  for (i=lastGAhandle; i<top; i++) {
    iloc = i%nb_max_outstanding;
    if (ga_ihdl_array[iloc].ahandle == NULL) {
      idx = iloc;
      break;
    }
  }
  /* If no free handle is found, clear the oldest handle */
  if (ga_ihdl_array[idx].ahandle != NULL) {
    Integer itmp;
    /* find value of itmp corresponding to oldest handle */
    gai_nbhdl_t *oldhdl = (gai_nbhdl_t*)&itmp;
    oldhdl->ihdl_index = idx;
    oldhdl->ga_nbtag = ga_ihdl_array[idx].ga_nbtag;
    nga_wait_internal(&itmp);
  }
  inbhandle->ihdl_index = idx;
  inbhandle->ga_nbtag = get_next_tag();
  ga_ihdl_array[idx].ahandle = NULL;
  ga_ihdl_array[idx].count = 0;
  ga_ihdl_array[idx].active = 1;
  ga_ihdl_array[idx].ga_nbtag = inbhandle->ga_nbtag;

  /* reset lastGAhandle to idx */
  lastGAhandle = idx;
  return;
}